

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O0

bool __thiscall
draco::KdTreeAttributesDecoder::TransformAttributeBackToSignedType<short>
          (KdTreeAttributesDecoder *this,PointAttribute *att,int num_processed_signed_components)

{
  value_type vVar1;
  value_type vVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  vector<short,_std::allocator<short>_> *this_00;
  size_t sVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  int in_EDX;
  PointAttribute *in_RSI;
  long in_RDI;
  int c;
  AttributeValueIndex avi;
  vector<short,_std::allocator<short>_> signed_val;
  vector<unsigned_short,_std::allocator<unsigned_short>_> unsigned_val;
  uint in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  size_type in_stack_ffffffffffffff48;
  PointAttribute *this_01;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffff50;
  GeometryAttribute *this_02;
  int local_7c;
  uint local_74;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_70;
  undefined1 local_69 [49];
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_38;
  int local_1c;
  PointAttribute *local_18;
  byte local_1;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  GeometryAttribute::num_components(&in_RSI->super_GeometryAttribute);
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x1f0b02);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x1f0b28);
  bVar3 = GeometryAttribute::num_components(&local_18->super_GeometryAttribute);
  this_00 = (vector<short,_std::allocator<short>_> *)(ulong)bVar3;
  this_02 = (GeometryAttribute *)local_69;
  std::allocator<short>::allocator((allocator<short> *)0x1f0b4c);
  std::vector<short,_std::allocator<short>_>::vector
            (this_00,in_stack_ffffffffffffff48,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  std::allocator<short>::~allocator((allocator<short> *)0x1f0b6c);
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_70,0);
  do {
    sVar6 = PointAttribute::size(local_18);
    local_74 = (uint)sVar6;
    bVar4 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator<
                      (&local_70,&local_74);
    if (!bVar4) {
      local_1 = 1;
LAB_001f0d7a:
      std::vector<short,_std::allocator<short>_>::~vector
                ((vector<short,_std::allocator<short>_> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      return (bool)(local_1 & 1);
    }
    this_01 = local_18;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[](&local_38,0);
    GeometryAttribute::GetValue
              (&this_01->super_GeometryAttribute,(AttributeValueIndex)(uint)((ulong)this_00 >> 0x20)
               ,(void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    local_7c = 0;
    while( true ) {
      in_stack_ffffffffffffff44 = local_7c;
      bVar3 = GeometryAttribute::num_components(&local_18->super_GeometryAttribute);
      if ((int)(uint)bVar3 <= in_stack_ffffffffffffff44) break;
      pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&local_38,(long)local_7c);
      in_stack_ffffffffffffff40 = (uint)*pvVar7;
      iVar5 = std::numeric_limits<int>::max();
      if (iVar5 < (int)in_stack_ffffffffffffff40) {
        local_1 = 0;
        goto LAB_001f0d7a;
      }
      pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&local_38,(long)local_7c);
      vVar1 = *pvVar7;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),
                          (long)(local_1c + local_7c));
      vVar2 = *pvVar8;
      pvVar9 = std::vector<short,_std::allocator<short>_>::operator[]
                         ((vector<short,_std::allocator<short>_> *)(local_69 + 1),(long)local_7c);
      *pvVar9 = vVar1 + (short)vVar2;
      local_7c = local_7c + 1;
    }
    std::vector<short,_std::allocator<short>_>::operator[]
              ((vector<short,_std::allocator<short>_> *)(local_69 + 1),0);
    GeometryAttribute::SetAttributeValue
              (this_02,(AttributeValueIndex)(uint)((ulong)in_RDI >> 0x20),this_00);
    IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator++(&local_70);
  } while( true );
}

Assistant:

bool KdTreeAttributesDecoder::TransformAttributeBackToSignedType(
    PointAttribute *att, int num_processed_signed_components) {
  typedef typename std::make_unsigned<SignedDataTypeT>::type UnsignedType;
  std::vector<UnsignedType> unsigned_val(att->num_components());
  std::vector<SignedDataTypeT> signed_val(att->num_components());

  for (AttributeValueIndex avi(0); avi < static_cast<uint32_t>(att->size());
       ++avi) {
    att->GetValue(avi, &unsigned_val[0]);
    for (int c = 0; c < att->num_components(); ++c) {
      // Up-cast |unsigned_val| to int32_t to ensure we don't overflow it for
      // smaller data types. But first check that the up-casting does not cause
      // signed integer overflow.
      if (unsigned_val[c] > std::numeric_limits<int32_t>::max()) {
        return false;
      }
      signed_val[c] = static_cast<SignedDataTypeT>(
          static_cast<int32_t>(unsigned_val[c]) +
          min_signed_values_[num_processed_signed_components + c]);
    }
    att->SetAttributeValue(avi, &signed_val[0]);
  }
  return true;
}